

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSubSimplexConvexCast.cpp
# Opt level: O3

bool __thiscall
cbtSubsimplexConvexCast::calcTimeOfImpact
          (cbtSubsimplexConvexCast *this,cbtTransform *fromA,cbtTransform *toA,cbtTransform *fromB,
          cbtTransform *toB,CastResult *result)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  cbtVector3 cVar14;
  cbtVector3 cVar15;
  bool bVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined4 uVar20;
  float fVar21;
  cbtScalar acVar22 [4];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  cbtVector3 hitA;
  cbtVector3 hitB;
  cbtVector3 local_238;
  float local_224;
  cbtScalar local_220;
  cbtScalar local_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  cbtVector3 local_1f8;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  cbtTransform *local_178;
  cbtTransform *local_170;
  cbtVector3 local_168;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [16];
  cbtVector3 local_a8;
  cbtVector3 local_98;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  cbtVector3 local_40;
  
  cbtVoronoiSimplexSolver::reset(this->m_simplexSolver);
  uVar2 = *(ulong *)(fromA->m_origin).m_floats;
  local_188._8_8_ = 0;
  local_188._0_8_ = uVar2;
  fVar21 = (fromB->m_origin).m_floats[0];
  uVar3 = *(ulong *)((fromB->m_origin).m_floats + 1);
  local_198._8_8_ = 0;
  local_198._0_8_ = uVar3;
  uVar4 = *(undefined8 *)(fromA->m_basis).m_el[1].m_floats;
  local_108._8_8_ = 0;
  local_108._0_8_ = *(ulong *)(fromA->m_basis).m_el[0].m_floats;
  local_b8._8_8_ = 0;
  local_b8._0_8_ = *(ulong *)(fromA->m_basis).m_el[2].m_floats;
  local_21c = (fromA->m_basis).m_el[2].m_floats[2];
  auVar18 = vmovshdup_avx(local_188);
  local_224 = (fromA->m_origin).m_floats[2];
  local_128 = ZEXT416((uint)(fromB->m_basis).m_el[0].m_floats[2]);
  local_d8 = ZEXT416((uint)fVar21);
  auVar19 = vmovshdup_avx(local_198);
  fVar1 = (fromA->m_basis).m_el[1].m_floats[2];
  local_118 = (float)uVar4;
  fStack_114 = (float)((ulong)uVar4 >> 0x20);
  fStack_110 = 0.0;
  fStack_10c = 0.0;
  local_218._4_4_ =
       ((toA->m_origin).m_floats[1] - auVar18._0_4_) - ((toB->m_origin).m_floats[1] - (float)uVar3);
  local_1c8 = ZEXT416((uint)local_218._4_4_);
  local_138 = ZEXT416((uint)(fromB->m_basis).m_el[1].m_floats[2]);
  local_148 = *(undefined8 *)(fromB->m_basis).m_el[0].m_floats;
  local_f8 = ZEXT416((uint)fVar1);
  uStack_140 = 0;
  uVar4 = *(undefined8 *)(fromB->m_basis).m_el[1].m_floats;
  fVar21 = ((toA->m_origin).m_floats[0] - (float)uVar2) - ((toB->m_origin).m_floats[0] - fVar21);
  local_218._0_4_ = local_218._4_4_;
  fStack_210 = (float)local_218._4_4_;
  fStack_20c = (float)local_218._4_4_;
  auVar18._0_4_ = local_118 * (float)local_218._4_4_;
  auVar18._4_4_ = fStack_114 * (float)local_218._4_4_;
  auVar18._8_4_ = (float)local_218._4_4_ * 0.0;
  auVar18._12_4_ = (float)local_218._4_4_ * 0.0;
  local_1d8._4_4_ = fVar21;
  local_1d8._0_4_ = fVar21;
  local_1d8._8_4_ = fVar21;
  local_1d8._12_4_ = fVar21;
  local_1b8 = ZEXT416((uint)fVar21);
  local_158 = (float)uVar4;
  fStack_154 = (float)((ulong)uVar4 >> 0x20);
  fStack_150 = 0.0;
  fStack_14c = 0.0;
  local_c8 = *(undefined8 *)(fromB->m_basis).m_el[2].m_floats;
  auVar18 = vfnmsub231ps_fma(auVar18,local_108,local_1d8);
  fVar21 = ((toA->m_origin).m_floats[2] - local_224) - ((toB->m_origin).m_floats[2] - auVar19._0_4_)
  ;
  local_1e8._4_4_ = fVar21;
  local_1e8._0_4_ = fVar21;
  local_1e8._8_4_ = fVar21;
  local_1e8._12_4_ = fVar21;
  local_1a8 = ZEXT416((uint)fVar21);
  uStack_c0 = 0;
  local_220 = (fromB->m_basis).m_el[2].m_floats[2];
  auVar18 = vfnmadd231ps_fma(auVar18,local_b8,local_1e8);
  local_e8 = ZEXT416((uint)(fromA->m_basis).m_el[0].m_floats[2]);
  auVar19 = vfnmsub231ss_fma(ZEXT416((uint)(fVar1 * (float)local_218._4_4_)),local_e8,local_1b8);
  auVar24 = vfnmadd231ss_fma(auVar19,ZEXT416((uint)local_21c),local_1a8);
  acVar22 = (cbtScalar  [4])vinsertps_avx(auVar18,auVar24,0x28);
  local_238.m_floats = acVar22;
  local_178 = toA;
  local_170 = toB;
  (*(this->m_convexA->super_cbtCollisionShape)._vptr_cbtCollisionShape[0x10])
            (this->m_convexA,&local_238);
  auVar30 = vmovshdup_avx((undefined1  [16])acVar22);
  auVar18 = vinsertps_avx(*(undefined1 (*) [16])((fromA->m_basis).m_el[0].m_floats + 1),
                          ZEXT416((uint)(fromA->m_basis).m_el[1].m_floats[1]),0x10);
  auVar19 = vinsertps_avx(*(undefined1 (*) [16])(fromA->m_basis).m_el[0].m_floats,
                          ZEXT416((uint)(fromA->m_basis).m_el[1].m_floats[0]),0x10);
  auVar40 = vinsertps_avx(*(undefined1 (*) [16])((fromA->m_basis).m_el[0].m_floats + 2),
                          ZEXT416((uint)(fromA->m_basis).m_el[1].m_floats[2]),0x10);
  auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar30._0_4_ * (fromA->m_basis).m_el[2].m_floats[1])),
                            (undefined1  [16])acVar22,
                            ZEXT416((uint)(fromA->m_basis).m_el[2].m_floats[0]));
  auVar23._0_4_ = acVar22[0];
  auVar23._4_4_ = auVar23._0_4_;
  auVar23._8_4_ = auVar23._0_4_;
  auVar23._12_4_ = auVar23._0_4_;
  auVar38 = vfmadd231ss_fma(auVar38,auVar24,ZEXT416((uint)(fromA->m_basis).m_el[2].m_floats[2]));
  auVar31._0_4_ = auVar24._0_4_;
  auVar31._4_4_ = auVar31._0_4_;
  auVar31._8_4_ = auVar31._0_4_;
  auVar31._12_4_ = auVar31._0_4_;
  auVar39._0_4_ = auVar30._0_4_ * auVar18._0_4_;
  auVar39._4_4_ = auVar30._4_4_ * auVar18._4_4_;
  auVar39._8_4_ = auVar30._8_4_ * auVar18._8_4_;
  auVar39._12_4_ = auVar30._12_4_ * auVar18._12_4_;
  fVar21 = auVar38._0_4_ + (fromA->m_origin).m_floats[2];
  auVar18 = vfmadd213ps_fma(auVar23,auVar19,auVar39);
  auVar38 = vfmadd213ps_fma(auVar31,auVar40,auVar18);
  local_208 = ZEXT416((uint)fVar21);
  uVar4 = vmovlps_avx(ZEXT416((uint)fVar21));
  uVar5 = *(undefined8 *)(fromB->m_basis).m_el[1].m_floats;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(fromB->m_basis).m_el[0].m_floats;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(fromB->m_basis).m_el[2].m_floats;
  auVar55._0_4_ = (float)uVar5 * (float)local_218._0_4_;
  auVar55._4_4_ = (float)((ulong)uVar5 >> 0x20) * (float)local_218._4_4_;
  auVar55._8_4_ = fStack_210 * 0.0;
  auVar55._12_4_ = fStack_20c * 0.0;
  auVar18 = vfmadd231ps_fma(auVar55,auVar30,local_1d8);
  auVar18 = vfmadd231ps_fma(auVar18,auVar56,local_1e8);
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)((float)local_1c8._0_4_ *
                                          (fromB->m_basis).m_el[1].m_floats[2])),local_1b8,
                            ZEXT416((uint)(fromB->m_basis).m_el[0].m_floats[2]));
  auVar19 = vfmadd231ss_fma(auVar19,local_1a8,ZEXT416((uint)(fromB->m_basis).m_el[2].m_floats[2]));
  local_238.m_floats = (cbtScalar  [4])vinsertps_avx(auVar18,auVar19,0x28);
  uVar5 = *(undefined8 *)(fromA->m_origin).m_floats;
  auVar24._0_4_ = auVar38._0_4_ + (float)uVar5;
  auVar24._4_4_ = auVar38._4_4_ + (float)((ulong)uVar5 >> 0x20);
  auVar24._8_4_ = auVar38._8_4_ + 0.0;
  auVar24._12_4_ = auVar38._12_4_ + 0.0;
  uVar5 = vmovlps_avx(auVar24);
  local_1f8.m_floats[2] = (cbtScalar)(int)uVar4;
  local_1f8.m_floats[3] = (cbtScalar)(int)((ulong)uVar4 >> 0x20);
  local_1f8.m_floats[0] = (cbtScalar)(int)uVar5;
  local_1f8.m_floats[1] = (cbtScalar)(int)((ulong)uVar5 >> 0x20);
  _local_218 = auVar24;
  (*(this->m_convexB->super_cbtCollisionShape)._vptr_cbtCollisionShape[0x10])
            (this->m_convexB,&local_238);
  auVar30 = vmovshdup_avx(auVar24);
  uVar20 = auVar24._0_4_;
  auVar54._4_4_ = uVar20;
  auVar54._0_4_ = uVar20;
  auVar54._8_4_ = uVar20;
  auVar54._12_4_ = uVar20;
  auVar18 = vinsertps_avx(*(undefined1 (*) [16])((fromB->m_basis).m_el[0].m_floats + 1),
                          ZEXT416((uint)(fromB->m_basis).m_el[1].m_floats[1]),0x10);
  auVar19 = vinsertps_avx(*(undefined1 (*) [16])(fromB->m_basis).m_el[0].m_floats,
                          ZEXT416((uint)(fromB->m_basis).m_el[1].m_floats[0]),0x10);
  auVar40 = vinsertps_avx(*(undefined1 (*) [16])((fromB->m_basis).m_el[0].m_floats + 2),
                          ZEXT416((uint)(fromB->m_basis).m_el[1].m_floats[2]),0x10);
  auVar52._0_4_ = auVar30._0_4_ * auVar18._0_4_;
  auVar52._4_4_ = auVar30._4_4_ * auVar18._4_4_;
  auVar52._8_4_ = auVar30._8_4_ * auVar18._8_4_;
  auVar52._12_4_ = auVar30._12_4_ * auVar18._12_4_;
  auVar30 = vfmadd231ss_fma(ZEXT416((uint)(auVar30._0_4_ * (fromB->m_basis).m_el[2].m_floats[1])),
                            auVar24,ZEXT416((uint)(fromB->m_basis).m_el[2].m_floats[0]));
  auVar18 = vfmadd213ps_fma(auVar19,auVar54,auVar52);
  uVar4 = *(undefined8 *)(fromB->m_origin).m_floats;
  uVar20 = auVar38._0_4_;
  auVar53._4_4_ = uVar20;
  auVar53._0_4_ = uVar20;
  auVar53._8_4_ = uVar20;
  auVar53._12_4_ = uVar20;
  auVar19 = vfmadd231ss_fma(auVar30,auVar38,ZEXT416((uint)(fromB->m_basis).m_el[2].m_floats[2]));
  auVar18 = vfmadd213ps_fma(auVar40,auVar53,auVar18);
  fVar21 = auVar19._0_4_ + (fromB->m_origin).m_floats[2];
  auVar19._0_4_ = auVar18._0_4_ + (float)uVar4;
  auVar19._4_4_ = auVar18._4_4_ + (float)((ulong)uVar4 >> 0x20);
  auVar19._8_4_ = auVar18._8_4_ + 0.0;
  auVar19._12_4_ = auVar18._12_4_ + 0.0;
  local_98.m_floats = (cbtScalar  [4])vinsertps_avx(auVar19,ZEXT416((uint)fVar21),0x28);
  auVar19 = vsubps_avx(_local_218,auVar19);
  fVar21 = (float)local_208._0_4_ - fVar21;
  local_238.m_floats = (cbtScalar  [4])vinsertps_avx(auVar19,ZEXT416((uint)fVar21),0x28);
  auVar40._0_4_ = auVar19._0_4_ * auVar19._0_4_;
  auVar40._4_4_ = auVar19._4_4_ * auVar19._4_4_;
  auVar40._8_4_ = auVar19._8_4_ * auVar19._8_4_;
  auVar40._12_4_ = auVar19._12_4_ * auVar19._12_4_;
  auVar18 = vmovshdup_avx(auVar40);
  auVar18 = vfmadd231ss_fma(auVar18,auVar19,auVar19);
  _local_218 = ZEXT816(0);
  auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
  auVar19 = ZEXT416(0) << 0x20;
  auVar40 = ZEXT816(0) << 0x20;
  if (result->m_subSimplexCastEpsilon < auVar18._0_4_) {
    auVar11._4_4_ = fStack_114;
    auVar11._0_4_ = local_118;
    auVar11._8_4_ = fStack_110;
    auVar11._12_4_ = fStack_10c;
    local_208 = vunpcklpd_avx(local_198,local_188);
    iVar17 = result->m_subSimplexCastMaxIterations + 1;
    local_188 = vinsertps_avx(local_e8,ZEXT416((uint)local_f8._0_4_),0x10);
    local_198 = vinsertps_avx(local_108,auVar11,0x1c);
    _local_58 = vinsertps_avx(auVar11,local_108,0x4c);
    auVar38._4_4_ = fStack_154;
    auVar38._0_4_ = local_158;
    auVar38._8_4_ = fStack_150;
    auVar38._12_4_ = fStack_14c;
    local_68 = vinsertps_avx(local_128,ZEXT416((uint)local_138._0_4_),0x10);
    auVar9._8_8_ = uStack_140;
    auVar9._0_8_ = local_148;
    local_78 = vinsertps_avx(auVar9,auVar38,0x1c);
    _local_88 = vinsertps_avx(auVar38,auVar9,0x4c);
    _local_218 = ZEXT816(0) << 0x20;
    do {
      iVar17 = iVar17 + -1;
      if (iVar17 == 0) break;
      auVar6._8_4_ = 0x80000000;
      auVar6._0_8_ = 0x8000000080000000;
      auVar6._12_4_ = 0x80000000;
      auVar18 = vxorps_avx512vl(ZEXT416((uint)local_238.m_floats[0]),auVar6);
      auVar48._0_4_ = local_238.m_floats[1] * local_118;
      auVar48._4_4_ = local_238.m_floats[1] * fStack_114;
      auVar48._8_4_ = local_238.m_floats[1] * fStack_110;
      auVar48._12_4_ = local_238.m_floats[1] * fStack_10c;
      auVar30 = vfnmsub231ss_fma(ZEXT416((uint)(local_238.m_floats[1] * (float)local_f8._0_4_)),
                                 ZEXT416((uint)local_238.m_floats[0]),ZEXT416((uint)local_e8._0_4_))
      ;
      auVar32._0_4_ = auVar18._0_4_;
      auVar32._4_4_ = auVar32._0_4_;
      auVar32._8_4_ = auVar32._0_4_;
      auVar32._12_4_ = auVar32._0_4_;
      auVar18 = vfmsub132ps_fma(auVar32,auVar48,local_108);
      auVar49._4_4_ = local_238.m_floats[2];
      auVar49._0_4_ = local_238.m_floats[2];
      auVar49._8_4_ = local_238.m_floats[2];
      auVar49._12_4_ = local_238.m_floats[2];
      auVar38 = vfnmadd231ss_fma(auVar30,auVar49,ZEXT416((uint)local_21c));
      auVar30 = vfnmadd231ps_fma(auVar18,auVar49,local_b8);
      acVar22 = (cbtScalar  [4])vinsertps_avx(auVar30,auVar38,0x28);
      local_1e8 = auVar40;
      local_1d8 = auVar19;
      local_168.m_floats = acVar22;
      (*(this->m_convexA->super_cbtCollisionShape)._vptr_cbtCollisionShape[0x10])
                (this->m_convexA,&local_168);
      fVar21 = acVar22[0];
      auVar41._0_4_ = local_b8._0_4_ * fVar21;
      auVar41._4_4_ = local_b8._4_4_ * acVar22[1];
      auVar41._8_4_ = local_b8._8_4_ * acVar22[2];
      auVar41._12_4_ = local_b8._12_4_ * acVar22[3];
      auVar18 = vmovshdup_avx(auVar41);
      auVar19 = vfmadd231ss_fma(auVar18,(undefined1  [16])acVar22,local_b8);
      auVar18 = vmovshdup_avx((undefined1  [16])acVar22);
      auVar50._0_4_ = auVar18._0_4_ * (float)local_58._0_4_;
      auVar50._4_4_ = auVar18._4_4_ * (float)local_58._4_4_;
      auVar50._8_4_ = auVar18._8_4_ * fStack_50;
      auVar50._12_4_ = auVar18._12_4_ * fStack_4c;
      auVar25._4_4_ = fVar21;
      auVar25._0_4_ = fVar21;
      auVar25._8_4_ = fVar21;
      auVar25._12_4_ = fVar21;
      auVar40 = vfmadd231ss_fma(auVar19,auVar30,ZEXT416((uint)local_21c));
      auVar33._0_4_ = auVar30._0_4_;
      auVar33._4_4_ = auVar33._0_4_;
      auVar33._8_4_ = auVar33._0_4_;
      auVar33._12_4_ = auVar33._0_4_;
      auVar18 = vfmadd132ps_fma(auVar25,auVar50,local_198);
      auVar51._4_4_ = local_238.m_floats[2];
      auVar51._0_4_ = local_238.m_floats[2];
      auVar51._8_4_ = local_238.m_floats[2];
      auVar51._12_4_ = local_238.m_floats[2];
      auVar19 = vfmadd132ps_fma(auVar33,auVar18,local_188);
      auVar18 = vpermilpd_avx(local_208,1);
      auVar26._0_4_ = auVar18._0_4_ + auVar19._0_4_;
      auVar26._4_4_ = auVar18._4_4_ + auVar19._4_4_;
      auVar26._8_4_ = auVar18._8_4_ + auVar19._8_4_;
      auVar26._12_4_ = auVar18._12_4_ + auVar19._12_4_;
      local_1f8.m_floats =
           (cbtScalar  [4])vinsertps_avx(auVar26,ZEXT416((uint)(auVar40._0_4_ + local_224)),0x28);
      auVar34._4_4_ = local_238.m_floats[0];
      auVar34._0_4_ = local_238.m_floats[0];
      auVar34._8_4_ = local_238.m_floats[0];
      auVar34._12_4_ = local_238.m_floats[0];
      auVar42._0_4_ = local_238.m_floats[1] * local_158;
      auVar42._4_4_ = local_238.m_floats[1] * fStack_154;
      auVar42._8_4_ = local_238.m_floats[1] * fStack_150;
      auVar42._12_4_ = local_238.m_floats[1] * fStack_14c;
      auVar10._8_8_ = uStack_140;
      auVar10._0_8_ = local_148;
      auVar18 = vfmadd231ps_fma(auVar42,auVar34,auVar10);
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(local_238.m_floats[1] * (float)local_138._0_4_)),
                                auVar34,ZEXT416((uint)local_128._0_4_));
      auVar12._8_8_ = uStack_c0;
      auVar12._0_8_ = local_c8;
      auVar18 = vfmadd231ps_fma(auVar18,auVar51,auVar12);
      auVar19 = vfmadd231ss_fma(auVar19,auVar51,ZEXT416((uint)local_220));
      acVar22 = (cbtScalar  [4])vinsertps_avx(auVar18,auVar19,0x28);
      local_168.m_floats = acVar22;
      (*(this->m_convexB->super_cbtCollisionShape)._vptr_cbtCollisionShape[0x10])
                (this->m_convexB,&local_168);
      cVar15.m_floats = local_1f8.m_floats;
      cVar14.m_floats = local_238.m_floats;
      auVar13._8_8_ = uStack_c0;
      auVar13._0_8_ = local_c8;
      fVar1 = acVar22[0];
      auVar43._0_4_ = (float)local_c8 * fVar1;
      auVar43._4_4_ = (float)((ulong)local_c8 >> 0x20) * acVar22[1];
      auVar43._8_4_ = (float)uStack_c0 * acVar22[2];
      auVar43._12_4_ = (float)((ulong)uStack_c0 >> 0x20) * acVar22[3];
      auVar18 = vmovshdup_avx(auVar43);
      auVar18 = vfmadd231ss_fma(auVar18,(undefined1  [16])acVar22,auVar13);
      auVar19 = vfmadd231ss_fma(auVar18,auVar34,ZEXT416((uint)local_220));
      auVar18 = vmovshdup_avx(local_208);
      auVar35._0_4_ = auVar34._0_4_;
      auVar35._4_4_ = auVar35._0_4_;
      auVar35._8_4_ = auVar35._0_4_;
      auVar35._12_4_ = auVar35._0_4_;
      fVar21 = auVar18._0_4_ + auVar19._0_4_;
      auVar18 = vmovshdup_avx((undefined1  [16])acVar22);
      auVar44._0_4_ = auVar18._0_4_ * (float)local_88._0_4_;
      auVar44._4_4_ = auVar18._4_4_ * (float)local_88._4_4_;
      auVar44._8_4_ = auVar18._8_4_ * fStack_80;
      auVar44._12_4_ = auVar18._12_4_ * fStack_7c;
      auVar27._4_4_ = fVar1;
      auVar27._0_4_ = fVar1;
      auVar27._8_4_ = fVar1;
      auVar27._12_4_ = fVar1;
      auVar18 = vfmadd132ps_fma(auVar27,auVar44,local_78);
      auVar18 = vfmadd132ps_fma(auVar35,auVar18,local_68);
      auVar19 = vpermt2ps_avx512vl(local_208,SUB6416(ZEXT464(4),0),local_d8);
      auVar28._0_4_ = auVar19._0_4_ + auVar18._0_4_;
      auVar28._4_4_ = auVar19._4_4_ + auVar18._4_4_;
      auVar28._8_4_ = auVar19._8_4_ + auVar18._8_4_;
      auVar28._12_4_ = auVar19._12_4_ + auVar18._12_4_;
      local_98.m_floats = (cbtScalar  [4])vinsertps_avx(auVar28,ZEXT416((uint)fVar21),0x28);
      auVar36._8_8_ = 0;
      auVar36._0_4_ = local_1f8.m_floats[0];
      auVar36._4_4_ = local_1f8.m_floats[1];
      auVar18 = vsubps_avx(auVar36,auVar28);
      local_1f8.m_floats[2] = cVar15.m_floats[2];
      auVar19 = ZEXT416((uint)(local_1f8.m_floats[2] - fVar21));
      local_a8.m_floats = (cbtScalar  [4])vinsertps_avx(auVar18,auVar19,0x28);
      if (1.0 < (float)local_218._0_4_) goto LAB_008ddedd;
      auVar40 = vmovshdup_avx(auVar18);
      auVar18 = vfmadd231ss_fma(ZEXT416((uint)(local_238.m_floats[1] * auVar40._0_4_)),
                                ZEXT416((uint)local_238.m_floats[0]),auVar18);
      auVar18 = vfmadd213ss_fma(auVar19,ZEXT416((uint)local_238.m_floats[2]),auVar18);
      if (0.0 < auVar18._0_4_) {
        auVar19 = vfmadd132ss_fma(ZEXT416((uint)local_238.m_floats[0]),
                                  ZEXT416((uint)(local_238.m_floats[1] * (float)local_1c8._0_4_)),
                                  ZEXT416((uint)local_1b8._0_4_));
        auVar19 = vfmadd132ss_fma(ZEXT416((uint)local_238.m_floats[2]),auVar19,
                                  ZEXT416((uint)local_1a8._0_4_));
        if (-1.4210855e-14 <= auVar19._0_4_) goto LAB_008ddedd;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = *(ulong *)((local_170->m_origin).m_floats + 1);
        auVar40 = vunpcklpd_avx(auVar45,*(undefined1 (*) [16])(local_178->m_origin).m_floats);
        fVar21 = (float)local_218._0_4_ - auVar18._0_4_ / auVar19._0_4_;
        _local_218 = ZEXT416((uint)fVar21);
        fVar1 = 1.0 - fVar21;
        auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * (local_178->m_origin).m_floats[2])),
                                  ZEXT416((uint)fVar1),ZEXT416((uint)(fromA->m_origin).m_floats[2]))
        ;
        local_224 = auVar18._0_4_;
        auVar46._0_4_ = fVar21 * auVar40._0_4_;
        auVar46._4_4_ = fVar21 * auVar40._4_4_;
        auVar46._8_4_ = fVar21 * auVar40._8_4_;
        auVar46._12_4_ = fVar21 * auVar40._12_4_;
        local_d8 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * (local_170->m_origin).m_floats[0])),
                                   ZEXT416((uint)fVar1),ZEXT416((uint)(fromB->m_origin).m_floats[0])
                                  );
        auVar29._4_4_ = fVar1;
        auVar29._0_4_ = fVar1;
        auVar29._8_4_ = fVar1;
        auVar29._12_4_ = fVar1;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(ulong *)((fromB->m_origin).m_floats + 1);
        auVar18 = vunpcklpd_avx(auVar37,*(undefined1 (*) [16])(fromA->m_origin).m_floats);
        local_208 = vfmadd213ps_fma(auVar18,auVar29,auVar46);
        local_1d8._8_8_ = 0;
        local_1d8._0_4_ = local_238.m_floats[0];
        local_1d8._4_4_ = local_238.m_floats[1];
        local_1e8._8_8_ = 0;
        local_1e8._0_4_ = local_238.m_floats[2];
        local_1e8._4_4_ = local_238.m_floats[3];
      }
      local_238.m_floats = cVar14.m_floats;
      local_1f8.m_floats = cVar15.m_floats;
      bVar16 = cbtVoronoiSimplexSolver::inSimplex(this->m_simplexSolver,&local_a8);
      if (!bVar16) {
        cbtVoronoiSimplexSolver::addVertex(this->m_simplexSolver,&local_a8,&local_1f8,&local_98);
      }
      bVar16 = cbtVoronoiSimplexSolver::closest(this->m_simplexSolver,&local_238);
      fVar21 = 0.0;
      if (bVar16) {
        auVar18 = vfmadd231ss_fma(ZEXT416((uint)(local_238.m_floats[1] * local_238.m_floats[1])),
                                  ZEXT416((uint)local_238.m_floats[0]),
                                  ZEXT416((uint)local_238.m_floats[0]));
        auVar18 = vfmadd213ss_fma(ZEXT416((uint)local_238.m_floats[2]),
                                  ZEXT416((uint)local_238.m_floats[2]),auVar18);
        fVar21 = auVar18._0_4_;
      }
      auVar19 = local_1d8;
      auVar40 = local_1e8;
    } while (result->m_subSimplexCastEpsilon < fVar21);
  }
  result->m_fraction = (cbtScalar)local_218._0_4_;
  auVar18 = vmovshdup_avx(auVar19);
  fVar21 = auVar18._0_4_;
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar21 * fVar21)),auVar19,auVar19);
  auVar18 = vfmadd231ss_fma(auVar18,auVar40,auVar40);
  if (1.4210855e-14 <= auVar18._0_4_) {
    auVar18 = vsqrtss_avx(auVar18,auVar18);
    fVar47 = 1.0 / auVar18._0_4_;
    fVar21 = fVar21 * fVar47;
    fVar1 = auVar19._0_4_ * fVar47;
    auVar38 = ZEXT416((uint)fVar1);
    fVar47 = auVar40._0_4_ * fVar47;
    auVar30 = ZEXT416((uint)fVar47);
    auVar19 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar21),0x10);
    auVar18 = vblendps_avx(ZEXT416((uint)fVar47),auVar40,2);
    auVar18 = vmovlhps_avx(auVar19,auVar18);
    *(undefined1 (*) [16])(result->m_normal).m_floats = auVar18;
  }
  else {
    auVar8._12_4_ = 0;
    auVar8._0_12_ = ZEXT812(0);
    fVar21 = 0.0;
    auVar38 = ZEXT816(0) << 0x20;
    *(undefined1 (*) [16])(result->m_normal).m_floats = auVar8 << 0x20;
    auVar30 = ZEXT416(0) << 0x20;
  }
  auVar18 = vfmadd213ss_fma(local_1b8,auVar38,ZEXT416((uint)(fVar21 * (float)local_1c8._0_4_)));
  auVar18 = vfmadd213ss_fma(local_1a8,auVar30,auVar18);
  auVar7._8_4_ = 0x80000000;
  auVar7._0_8_ = 0x8000000080000000;
  auVar7._12_4_ = 0x80000000;
  auVar19 = vxorps_avx512vl(ZEXT416((uint)result->m_allowedPenetration),auVar7);
  if (auVar19._0_4_ <= auVar18._0_4_) {
LAB_008ddedd:
    bVar16 = false;
  }
  else {
    cbtVoronoiSimplexSolver::compute_points(this->m_simplexSolver,&local_168,&local_40);
    bVar16 = true;
    *(undefined8 *)(result->m_hitPoint).m_floats = local_40.m_floats._0_8_;
    *(undefined8 *)((result->m_hitPoint).m_floats + 2) = local_40.m_floats._8_8_;
  }
  return bVar16;
}

Assistant:

bool cbtSubsimplexConvexCast::calcTimeOfImpact(
	const cbtTransform& fromA,
	const cbtTransform& toA,
	const cbtTransform& fromB,
	const cbtTransform& toB,
	CastResult& result)
{
	m_simplexSolver->reset();

	cbtVector3 linVelA, linVelB;
	linVelA = toA.getOrigin() - fromA.getOrigin();
	linVelB = toB.getOrigin() - fromB.getOrigin();

	cbtScalar lambda = cbtScalar(0.);

	cbtTransform interpolatedTransA = fromA;
	cbtTransform interpolatedTransB = fromB;

	///take relative motion
	cbtVector3 r = (linVelA - linVelB);
	cbtVector3 v;

	cbtVector3 supVertexA = fromA(m_convexA->localGetSupportingVertex(-r * fromA.getBasis()));
	cbtVector3 supVertexB = fromB(m_convexB->localGetSupportingVertex(r * fromB.getBasis()));
	v = supVertexA - supVertexB;
	int maxIter = result.m_subSimplexCastMaxIterations;

	cbtVector3 n;
	n.setValue(cbtScalar(0.), cbtScalar(0.), cbtScalar(0.));

	cbtVector3 c;

	cbtScalar dist2 = v.length2();



	cbtVector3 w, p;
	cbtScalar VdotR;

	while ((dist2 > result.m_subSimplexCastEpsilon) && maxIter--)
	{
		supVertexA = interpolatedTransA(m_convexA->localGetSupportingVertex(-v * interpolatedTransA.getBasis()));
		supVertexB = interpolatedTransB(m_convexB->localGetSupportingVertex(v * interpolatedTransB.getBasis()));
		w = supVertexA - supVertexB;

		cbtScalar VdotW = v.dot(w);

		if (lambda > cbtScalar(1.0))
		{
			return false;
		}

		if (VdotW > cbtScalar(0.))
		{
			VdotR = v.dot(r);

			if (VdotR >= -(SIMD_EPSILON * SIMD_EPSILON))
				return false;
			else
			{
				lambda = lambda - VdotW / VdotR;
				//interpolate to next lambda
				//	x = s + lambda * r;
				interpolatedTransA.getOrigin().setInterpolate3(fromA.getOrigin(), toA.getOrigin(), lambda);
				interpolatedTransB.getOrigin().setInterpolate3(fromB.getOrigin(), toB.getOrigin(), lambda);
				//m_simplexSolver->reset();
				//check next line
				w = supVertexA - supVertexB;

				n = v;
			}
		}
		///Just like regular GJK only add the vertex if it isn't already (close) to current vertex, it would lead to divisions by zero and NaN etc.
		if (!m_simplexSolver->inSimplex(w))
			m_simplexSolver->addVertex(w, supVertexA, supVertexB);

		if (m_simplexSolver->closest(v))
		{
			dist2 = v.length2();

			//todo: check this normal for validity
			//n=v;
			//printf("V=%f , %f, %f\n",v[0],v[1],v[2]);
			//printf("DIST2=%f\n",dist2);
			//printf("numverts = %i\n",m_simplexSolver->numVertices());
		}
		else
		{
			dist2 = cbtScalar(0.);
		}
	}

	//int numiter = MAX_ITERATIONS - maxIter;
	//	printf("number of iterations: %d", numiter);

	//don't report a time of impact when moving 'away' from the hitnormal

	result.m_fraction = lambda;
	if (n.length2() >= (SIMD_EPSILON * SIMD_EPSILON))
		result.m_normal = n.normalized();
	else
		result.m_normal = cbtVector3(cbtScalar(0.0), cbtScalar(0.0), cbtScalar(0.0));

	//don't report time of impact for motion away from the contact normal (or causes minor penetration)
	if (result.m_normal.dot(r) >= -result.m_allowedPenetration)
		return false;

	cbtVector3 hitA, hitB;
	m_simplexSolver->compute_points(hitA, hitB);
	result.m_hitPoint = hitB;
	return true;
}